

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_simplex.cc
# Opt level: O0

double extrapolate4(osn_context *ctx,int xsb,int ysb,int zsb,int wsb,double dx,double dy,double dz,
                   double dw)

{
  int16_t *piVar1;
  uint uVar2;
  int index;
  int16_t *perm;
  double dw_local;
  double dz_local;
  double dy_local;
  double dx_local;
  int wsb_local;
  int zsb_local;
  int ysb_local;
  int xsb_local;
  osn_context *ctx_local;
  
  piVar1 = ctx->perm;
  uVar2 = (int)piVar1[(int)(piVar1[(int)(piVar1[(int)(piVar1[(int)(xsb & 0xff)] + ysb & 0xff)] + zsb
                                        & 0xff)] + wsb & 0xff)] & 0xfc;
  return (double)(int)gradients4D[(int)(uVar2 + 3)] * dw +
         (double)(int)gradients4D[(int)(uVar2 + 2)] * dz +
         (double)(int)gradients4D[(int)uVar2] * dx + (double)(int)gradients4D[(int)(uVar2 + 1)] * dy
  ;
}

Assistant:

static double extrapolate4(struct osn_context* ctx, int xsb, int ysb, int zsb,
    int wsb, double dx, double dy, double dz, double dw)
{
    int16_t* perm = ctx->perm;
    int index =
        perm[(perm[(perm[(perm[xsb & 0xFF] + ysb) & 0xFF] + zsb) & 0xFF] +
                 wsb) &
             0xFF] &
        0xFC;
    return gradients4D[index] * dx + gradients4D[index + 1] * dy +
           gradients4D[index + 2] * dz + gradients4D[index + 3] * dw;
}